

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GdlRule.h
# Opt level: O1

void __thiscall GdlSetAttrItem::GdlSetAttrItem(GdlSetAttrItem *this,GdlSetAttrItem *rit)

{
  pointer *pppGVar1;
  iterator __position;
  GdlAttrValueSpec *in_RAX;
  GdlAttrValueSpec *this_00;
  ulong uVar2;
  pointer ppGVar3;
  GdlAttrValueSpec *local_38;
  
  local_38 = in_RAX;
  GdlRuleItem::GdlRuleItem(&this->super_GdlRuleItem,&rit->super_GdlRuleItem);
  (this->super_GdlRuleItem)._vptr_GdlRuleItem = (_func_int **)&PTR_Clone_002434f8;
  (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_nAttachTo = -1;
  ppGVar3 = (rit->m_vpavs).
            super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((rit->m_vpavs).super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
      _M_impl.super__Vector_impl_data._M_finish != ppGVar3) {
    uVar2 = 0;
    do {
      this_00 = (GdlAttrValueSpec *)operator_new(0x48);
      GdlAttrValueSpec::GdlAttrValueSpec(this_00,ppGVar3[uVar2]);
      __position._M_current =
           (this->m_vpavs).
           super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_38 = this_00;
      if (__position._M_current ==
          (this->m_vpavs).
          super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>>::
        _M_realloc_insert<GdlAttrValueSpec*>
                  ((vector<GdlAttrValueSpec*,std::allocator<GdlAttrValueSpec*>> *)&this->m_vpavs,
                   __position,&local_38);
      }
      else {
        *__position._M_current = this_00;
        pppGVar1 = &(this->m_vpavs).
                    super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>.
                    _M_impl.super__Vector_impl_data._M_finish;
        *pppGVar1 = *pppGVar1 + 1;
      }
      uVar2 = uVar2 + 1;
      ppGVar3 = (rit->m_vpavs).
                super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>._M_impl.
                super__Vector_impl_data._M_start;
    } while (uVar2 < (ulong)((long)(rit->m_vpavs).
                                   super__Vector_base<GdlAttrValueSpec_*,_std::allocator<GdlAttrValueSpec_*>_>
                                   ._M_impl.super__Vector_impl_data._M_finish - (long)ppGVar3 >> 3))
    ;
  }
  return;
}

Assistant:

GdlSetAttrItem(const GdlSetAttrItem & rit)
		:	GdlRuleItem(rit)
	{
		m_nAttachTo = -1;
		Assert(m_vpavs.size() == 0);
		for (size_t i = 0; i < rit.m_vpavs.size(); ++i)
			m_vpavs.push_back(new GdlAttrValueSpec(*rit.m_vpavs[i]));
	}